

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> *
blockHasVar(VarId *var,
           map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
           *def,map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *use)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  size_type sVar4;
  reference pvVar5;
  VarId *in_RSI;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  int i_1;
  int i;
  iterator it;
  set<int,_std::less<int>,_std::allocator<int>_> *s;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffff20;
  int local_84;
  _Self local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  undefined1 local_60;
  int local_44;
  _Self local_40;
  _Base_ptr local_38;
  undefined1 local_29;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
  local_28 [5];
  
  std::
  _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
  ::_Rb_tree_iterator(local_28);
  local_29 = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x27a042);
  local_38 = (_Base_ptr)
             std::
             map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::begin((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  local_28[0]._M_node = local_38;
  do {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
         ::end((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    bVar1 = std::operator!=(local_28,&local_40);
    if (!bVar1) {
      local_78 = (_Base_ptr)
                 std::
                 map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                 ::begin((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      local_28[0]._M_node = local_78;
      do {
        local_80._M_node =
             (_Base_ptr)
             std::
             map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::end((map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
        bVar1 = std::operator!=(local_28,&local_80);
        if (!bVar1) {
          return in_RDI;
        }
        local_84 = 0;
        while( true ) {
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                                 *)0x27a223);
          sVar4 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size
                            (&ppVar3->second);
          if (sVar4 <= (ulong)(long)local_84) break;
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                                 *)0x27a24d);
          pvVar5 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator[]
                             (&ppVar3->second,(long)local_84);
          in_stack_ffffffffffffff0f = mir::inst::VarId::operator==(pvVar5,in_RSI);
          if ((bool)in_stack_ffffffffffffff0f) {
            std::
            _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                          *)0x27a28b);
            pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               in_stack_ffffffffffffff20._M_node,
                               (value_type_conflict3 *)
                               CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
            in_stack_ffffffffffffff00 = pVar6.first._M_node;
            in_stack_fffffffffffffeff = pVar6.second;
            break;
          }
          local_84 = local_84 + 1;
        }
        std::
        _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                     (int)((ulong)in_stack_ffffffffffffff00._M_node >> 0x20));
      } while( true );
    }
    local_44 = 0;
    while( true ) {
      uVar2 = (ulong)local_44;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                             *)0x27a0b9);
      sVar4 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size
                        (&ppVar3->second);
      if (sVar4 <= uVar2) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                             *)0x27a0e3);
      pvVar5 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator[]
                         (&ppVar3->second,(long)local_44);
      bVar1 = mir::inst::VarId::operator==(pvVar5,in_RSI);
      if (bVar1) {
        std::
        _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                      *)0x27a121);
        pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_ffffffffffffff20._M_node,
                           (value_type_conflict3 *)
                           CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        in_stack_ffffffffffffff20 = pVar6.first._M_node;
        in_stack_ffffffffffffff1f = pVar6.second;
        local_68 = in_stack_ffffffffffffff20._M_node;
        local_60 = in_stack_ffffffffffffff1f;
        break;
      }
      local_44 = local_44 + 1;
    }
    local_70 = (_Base_ptr)
               std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
               ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                            (int)((ulong)in_stack_ffffffffffffff00._M_node >> 0x20));
  } while( true );
}

Assistant:

set<int> blockHasVar(mir::inst::VarId var,
                     map<int, vector<mir::inst::VarId>> def,
                     map<int, vector<mir::inst::VarId>> use) {
  map<int, vector<mir::inst::VarId>>::iterator it;
  set<int> s;
  for (it = def.begin(); it != def.end(); it++) {
    for (int i = 0; i < it->second.size(); i++) {
      if (it->second[i] == var) {
        s.insert(it->first);
        break;
      }
    }
  }
  for (it = use.begin(); it != use.end(); it++) {
    for (int i = 0; i < it->second.size(); i++) {
      if (it->second[i] == var) {
        s.insert(it->first);
        break;
      }
    }
  }
  return s;
}